

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TernaryExpression.hpp
# Opt level: O0

bool __thiscall Kandinsky::TernaryExpression::isConstant(TernaryExpression *this)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  byte local_9;
  
  peVar3 = std::
           __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x137ecb);
  uVar1 = (*peVar3->_vptr_BaseExpression[6])();
  local_9 = 0;
  if ((uVar1 & 1) != 0) {
    peVar3 = std::
             __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x137ef0);
    uVar1 = (*peVar3->_vptr_BaseExpression[6])();
    local_9 = 0;
    if ((uVar1 & 1) != 0) {
      peVar3 = std::
               __shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x137f15);
      iVar2 = (*peVar3->_vptr_BaseExpression[6])();
      local_9 = (byte)iVar2;
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

virtual bool isConstant() const
        {
            return m_arg1->isConstant() && m_arg2->isConstant() && m_arg3->isConstant();
        }